

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ComparePointerArrays(size_t count,ON__UINT_PTR *a,ON__UINT_PTR *b)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint *index;
  uint **local_260;
  uint local_258;
  int local_254;
  uint i;
  int rc;
  uint *bdex;
  uint *adex;
  uint stack_buffer [128];
  ON__UINT_PTR *b_local;
  ON__UINT_PTR *a_local;
  size_t count_local;
  
  if (count == 0) {
    count_local._4_4_ = 0;
  }
  else if (a == (ON__UINT_PTR *)0x0) {
    count_local._4_4_ = -1;
    if (b == (ON__UINT_PTR *)0x0) {
      count_local._4_4_ = 0;
    }
  }
  else if (b == (ON__UINT_PTR *)0x0) {
    count_local._4_4_ = 1;
  }
  else {
    stack_buffer._504_8_ = b;
    if (count == 1) {
      count_local._4_4_ = Compare_ON__UINT_PTR(a,b);
    }
    else {
      if (count * 2 < 0x81) {
        local_260 = &adex;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = count << 1;
        uVar2 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar2 = 0xffffffffffffffff;
        }
        local_260 = (uint **)operator_new__(uVar2,(nothrow_t *)&std::nothrow);
      }
      if (local_260 == (uint **)0x0) {
        count_local._4_4_ = 0;
      }
      else {
        index = (uint *)((long)local_260 + count * 4);
        ON_Sort(quick_sort,(uint *)local_260,a,count,8,Compare_ON__UINT_PTR);
        ON_Sort(quick_sort,index,(void *)stack_buffer._504_8_,count,8,Compare_ON__UINT_PTR);
        local_254 = 0;
        for (local_258 = 0; local_254 == 0 && local_258 < count; local_258 = local_258 + 1) {
          local_254 = Compare_ON__UINT_PTR
                                (a + *(uint *)((long)local_260 + (ulong)local_258 * 4),
                                 (void *)(stack_buffer._504_8_ + (ulong)index[local_258] * 8));
        }
        if ((local_260 != &adex) && (local_260 != (uint **)0x0)) {
          operator_delete__(local_260);
        }
        count_local._4_4_ = local_254;
      }
    }
  }
  return count_local._4_4_;
}

Assistant:

static int ComparePointerArrays(
  size_t count,
  const ON__UINT_PTR* a,
  const ON__UINT_PTR* b
  )
{
  if (count <= 0)
    return 0;
  if (nullptr == a)
    return ((nullptr == b) ? 0 : -1);
  if (nullptr == b)
    return 1;
  if (1 == count)
    return Compare_ON__UINT_PTR(a, b);

  unsigned int stack_buffer[128];
  unsigned int* adex
    = (2 * count <= sizeof(stack_buffer) / sizeof(stack_buffer[0]))
    ? stack_buffer
    : new (std::nothrow) unsigned int[2 * count];  
  if (nullptr == adex)
    return 0;
  
  unsigned int* bdex = adex + count;
  ON_Sort(ON::sort_algorithm::quick_sort, adex, a, count, sizeof(a[0]), Compare_ON__UINT_PTR);
  ON_Sort(ON::sort_algorithm::quick_sort, bdex, b, count, sizeof(b[0]), Compare_ON__UINT_PTR);
  
  int rc = 0;
  for (unsigned int i = 0; 0 == rc && i < count; i++)
  {
    rc = Compare_ON__UINT_PTR(a + adex[i], b + bdex[i]);
  }

  if (adex != stack_buffer)
    delete[] adex;

  return rc;
}